

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O3

void __thiscall
ChaCha20Aligned::Crypt
          (ChaCha20Aligned *this,Span<const_std::byte> in_bytes,Span<std::byte> out_bytes)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  long lVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  byte *pbVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  byte *pbVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint32_t uVar44;
  uint32_t uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  long in_FS_OFFSET;
  int iVar59;
  long local_f8;
  ulong local_f0;
  int local_68;
  int iStack_64;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  pbVar27 = out_bytes.m_data;
  local_f0 = in_bytes.m_size;
  pbVar34 = in_bytes.m_data;
  lVar11 = *(long *)(in_FS_OFFSET + 0x28);
  if (local_f0 != out_bytes.m_size) {
    __assert_fail("in_bytes.size() == out_bytes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0xa3,"void ChaCha20Aligned::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  if (((undefined1  [16])in_bytes & (undefined1  [16])0x3f) == (undefined1  [16])0x0) {
    if (0x3f < local_f0) {
      local_f0 = local_f0 >> 6;
      uVar2 = this->input[0];
      uVar3 = this->input[1];
      uVar25 = *(undefined8 *)(this->input + 1);
      uVar26 = *(undefined8 *)(this->input + 3);
      uVar4 = this->input[5];
      uVar12 = *(undefined8 *)(this->input + 5);
      uVar5 = this->input[10];
      uVar6 = this->input[2];
      uVar30 = uVar6 + 0x79622d32 ^ uVar5;
      uVar31 = uVar30 << 0x10 | uVar30 >> 0x10;
      uVar30 = this->input[0xb];
      uVar42 = (int)*(undefined8 *)(this->input + 6) + uVar31;
      uVar51 = uVar42 ^ uVar6;
      uVar51 = uVar51 << 0xc | uVar51 >> 0x14;
      uVar56 = uVar51 + uVar6 + 0x79622d32;
      uVar31 = uVar31 ^ uVar56;
      uVar32 = uVar31 << 8 | uVar31 >> 0x18;
      uVar42 = uVar42 + uVar32;
      uVar51 = uVar51 ^ uVar42;
      uVar52 = uVar51 << 7 | uVar51 >> 0x19;
      uVar6 = this->input[3];
      uVar31 = uVar6 + 0x6b206574 ^ uVar30;
      uVar31 = uVar31 << 0x10 | uVar31 >> 0x10;
      iVar59 = (int)((ulong)*(undefined8 *)(this->input + 6) >> 0x20);
      uVar51 = iVar59 + uVar31;
      uVar53 = uVar51 ^ uVar6;
      uVar54 = uVar53 << 0xc | uVar53 >> 0x14;
      uVar47 = uVar54 + uVar6 + 0x6b206574;
      uVar31 = uVar31 ^ uVar47;
      uVar53 = uVar31 << 8 | uVar31 >> 0x18;
      uVar51 = uVar51 + uVar53;
      uVar54 = uVar54 ^ uVar51;
      uVar54 = uVar54 << 7 | uVar54 >> 0x19;
      uVar56 = uVar56 + uVar54;
      uVar31 = uVar3 + 0x3320646e;
      uVar7 = this->input[4];
      local_f8 = 0;
      uVar44 = this->input[9];
      uVar6 = this->input[8];
      while( true ) {
        local_f0 = local_f0 - 1;
        uVar43 = uVar6 + 1;
        uVar45 = uVar44 + (uVar43 == 0);
        uVar38 = uVar6 ^ uVar2 + 0x61707865;
        uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
        uVar55 = uVar38 + uVar7;
        uVar57 = uVar55 ^ uVar2;
        uVar57 = uVar57 << 0xc | uVar57 >> 0x14;
        uVar35 = uVar57 + uVar2 + 0x61707865;
        uVar38 = uVar38 ^ uVar35;
        uVar39 = uVar38 << 8 | uVar38 >> 0x18;
        uVar55 = uVar55 + uVar39;
        uVar57 = uVar57 ^ uVar55;
        uVar58 = uVar57 << 7 | uVar57 >> 0x19;
        uVar38 = uVar44 ^ uVar31;
        uVar48 = uVar38 << 0x10 | uVar38 >> 0x10;
        uVar38 = uVar4 + uVar48;
        uVar57 = uVar38 ^ uVar3;
        uVar28 = uVar57 << 0xc | uVar57 >> 0x14;
        uVar57 = uVar28 + uVar31;
        uVar48 = uVar48 ^ uVar57;
        uVar49 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar49;
        uVar28 = uVar28 ^ uVar38;
        uVar48 = uVar28 << 7 | uVar28 >> 0x19;
        uVar35 = uVar35 + uVar48;
        uVar28 = uVar35 ^ uVar53;
        uVar36 = uVar28 << 0x10 | uVar28 >> 0x10;
        uVar28 = uVar42 + uVar36;
        uVar48 = uVar48 ^ uVar28;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar35 = uVar35 + uVar48;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar48 = uVar48 ^ uVar28;
        uVar29 = uVar48 << 7 | uVar48 >> 0x19;
        uVar57 = uVar57 + uVar52;
        uVar39 = uVar39 ^ uVar57;
        uVar40 = uVar39 << 0x10 | uVar39 >> 0x10;
        uVar39 = uVar40 + uVar51;
        uVar48 = uVar39 ^ uVar52;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar57 = uVar57 + uVar48;
        uVar40 = uVar40 ^ uVar57;
        uVar41 = uVar40 << 8 | uVar40 >> 0x18;
        uVar39 = uVar39 + uVar41;
        uVar48 = uVar48 ^ uVar39;
        uVar37 = uVar48 << 7 | uVar48 >> 0x19;
        uVar49 = uVar49 ^ uVar56;
        uVar40 = uVar49 << 0x10 | uVar49 >> 0x10;
        uVar55 = uVar55 + uVar40;
        uVar48 = uVar55 ^ uVar54;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar49 = uVar48 + uVar56;
        uVar40 = uVar40 ^ uVar49;
        uVar50 = uVar40 << 8 | uVar40 >> 0x18;
        uVar55 = uVar55 + uVar50;
        uVar48 = uVar48 ^ uVar55;
        uVar33 = uVar48 << 7 | uVar48 >> 0x19;
        uVar40 = uVar58 + uVar47;
        uVar48 = uVar40 ^ uVar32;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar58 = uVar58 ^ uVar38;
        uVar58 = uVar58 << 0xc | uVar58 >> 0x14;
        uVar40 = uVar40 + uVar58;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar58 = uVar58 ^ uVar38;
        uVar58 = uVar58 << 7 | uVar58 >> 0x19;
        uVar35 = uVar35 + uVar58;
        uVar41 = uVar41 ^ uVar35;
        uVar46 = uVar41 << 0x10 | uVar41 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar58 = uVar58 ^ uVar55;
        uVar41 = uVar58 << 0xc | uVar58 >> 0x14;
        uVar35 = uVar35 + uVar41;
        uVar46 = uVar46 ^ uVar35;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar57 = uVar57 + uVar29;
        uVar50 = uVar50 ^ uVar57;
        uVar58 = uVar50 << 0x10 | uVar50 >> 0x10;
        uVar38 = uVar38 + uVar58;
        uVar29 = uVar29 ^ uVar38;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar57 = uVar57 + uVar29;
        uVar58 = uVar58 ^ uVar57;
        uVar50 = uVar58 << 8 | uVar58 >> 0x18;
        uVar38 = uVar38 + uVar50;
        uVar29 = uVar29 ^ uVar38;
        uVar58 = uVar29 << 7 | uVar29 >> 0x19;
        uVar49 = uVar49 + uVar37;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar37 = uVar37 ^ uVar28;
        uVar29 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar29 = uVar29 ^ uVar28;
        uVar37 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar33;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar33 = uVar33 ^ uVar39;
        uVar29 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar35 = uVar35 + uVar58;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar58 = uVar58 ^ uVar28;
        uVar33 = uVar58 << 0xc | uVar58 >> 0x14;
        uVar35 = uVar35 + uVar33;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar33 = uVar33 ^ uVar28;
        uVar58 = uVar33 << 7 | uVar33 >> 0x19;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar39 = uVar39 + uVar46;
        uVar37 = uVar37 ^ uVar39;
        uVar33 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar39 = uVar39 + uVar46;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar50 = uVar50 ^ uVar49;
        uVar37 = uVar50 << 0x10 | uVar50 >> 0x10;
        uVar55 = uVar55 + uVar37;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar37 = uVar37 ^ uVar49;
        uVar50 = uVar37 << 8 | uVar37 >> 0x18;
        uVar55 = uVar55 + uVar50;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar37 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar37;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar35 = uVar35 + uVar37;
        uVar46 = uVar46 ^ uVar35;
        uVar41 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar55 = uVar55 + uVar41;
        uVar37 = uVar37 ^ uVar55;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar35 = uVar35 + uVar37;
        uVar41 = uVar41 ^ uVar35;
        uVar46 = uVar41 << 8 | uVar41 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar37 = uVar37 ^ uVar55;
        uVar41 = uVar37 << 7 | uVar37 >> 0x19;
        uVar57 = uVar57 + uVar58;
        uVar50 = uVar50 ^ uVar57;
        uVar50 = uVar50 << 0x10 | uVar50 >> 0x10;
        uVar38 = uVar38 + uVar50;
        uVar58 = uVar58 ^ uVar38;
        uVar37 = uVar58 << 0xc | uVar58 >> 0x14;
        uVar57 = uVar57 + uVar37;
        uVar50 = uVar50 ^ uVar57;
        uVar50 = uVar50 << 8 | uVar50 >> 0x18;
        uVar38 = uVar38 + uVar50;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar57 = uVar57 + uVar33;
        uVar46 = uVar46 ^ uVar57;
        uVar58 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar50 = uVar50 ^ uVar49;
        uVar46 = uVar50 << 0x10 | uVar50 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar35 = uVar35 + uVar41;
        uVar58 = uVar58 ^ uVar35;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar57 = uVar57 + uVar37;
        uVar46 = uVar46 ^ uVar57;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar38 = uVar38 + uVar46;
        uVar37 = uVar37 ^ uVar38;
        uVar37 = uVar37 << 7 | uVar37 >> 0x19;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar28 = uVar28 + uVar48;
        uVar33 = uVar33 ^ uVar28;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar49 = uVar49 + uVar33;
        uVar48 = uVar48 ^ uVar49;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar28 = uVar28 + uVar48;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar39 = uVar39 + uVar36;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar40 = uVar40 + uVar29;
        uVar36 = uVar36 ^ uVar40;
        uVar36 = uVar36 << 8 | uVar36 >> 0x18;
        uVar33 = uVar33 ^ uVar28;
        uVar39 = uVar39 + uVar36;
        uVar35 = uVar35 + uVar37;
        uVar36 = uVar36 ^ uVar35;
        uVar36 = uVar36 << 0x10 | uVar36 >> 0x10;
        uVar28 = uVar28 + uVar36;
        uVar37 = uVar37 ^ uVar28;
        uVar37 = uVar37 << 0xc | uVar37 >> 0x14;
        uVar36 = uVar35 + uVar37 ^ uVar36;
        uVar55 = uVar55 + uVar58;
        uVar41 = uVar41 ^ uVar55;
        uVar29 = uVar29 ^ uVar39;
        uVar29 = uVar29 << 7 | uVar29 >> 0x19;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 0x10 | uVar46 >> 0x10;
        uVar55 = uVar55 + uVar46;
        uVar29 = uVar29 ^ uVar55;
        uVar29 = uVar29 << 0xc | uVar29 >> 0x14;
        uVar49 = uVar49 + uVar29;
        uVar46 = uVar46 ^ uVar49;
        uVar46 = uVar46 << 8 | uVar46 >> 0x18;
        uVar55 = uVar55 + uVar46;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar58 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar57 = uVar57 + uVar33;
        uVar58 = uVar58 ^ uVar57;
        uVar41 = uVar41 << 7 | uVar41 >> 0x19;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0x10 | uVar48 >> 0x10;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar40 = uVar40 + uVar41;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 8 | uVar48 >> 0x18;
        uVar38 = uVar38 + uVar48;
        uVar41 = uVar41 ^ uVar38;
        uVar29 = uVar29 ^ uVar55;
        uVar50 = uVar36 << 8 | uVar36 >> 0x18;
        uVar28 = uVar28 + uVar50;
        uVar36 = uVar37 ^ uVar28;
        uVar58 = uVar58 << 8 | uVar58 >> 0x18;
        uVar39 = uVar39 + uVar58;
        uVar33 = uVar33 ^ uVar39;
        uVar8 = *(undefined4 *)(pbVar34 + local_f8 + 0x34);
        uVar9 = *(undefined4 *)(pbVar34 + local_f8 + 0x38);
        uVar10 = *(undefined4 *)(pbVar34 + local_f8 + 0x3c);
        pbVar1 = pbVar34 + local_f8 + 4;
        uVar17 = *(undefined4 *)pbVar1;
        uVar18 = *(undefined4 *)(pbVar1 + 4);
        uVar19 = *(undefined4 *)(pbVar1 + 8);
        uVar20 = *(undefined4 *)(pbVar1 + 0xc);
        pbVar1 = pbVar34 + local_f8 + 0x14;
        uVar21 = *(undefined4 *)pbVar1;
        uVar22 = *(undefined4 *)(pbVar1 + 4);
        uVar23 = *(undefined4 *)(pbVar1 + 8);
        uVar24 = *(undefined4 *)(pbVar1 + 0xc);
        pbVar1 = pbVar34 + local_f8 + 0x24;
        uVar13 = *(undefined4 *)pbVar1;
        uVar14 = *(undefined4 *)(pbVar1 + 4);
        uVar15 = *(undefined4 *)(pbVar1 + 8);
        uVar16 = *(undefined4 *)(pbVar1 + 0xc);
        *(undefined4 *)(pbVar27 + local_f8) =
             uVar37 + uVar35 + 0x61707865 ^ *(undefined4 *)(pbVar34 + local_f8);
        local_48 = (int)uVar25;
        iStack_44 = (int)((ulong)uVar25 >> 0x20);
        iStack_40 = (int)uVar26;
        iStack_3c = (int)((ulong)uVar26 >> 0x20);
        local_68 = (int)uVar12;
        iStack_64 = (int)((ulong)uVar12 >> 0x20);
        pbVar1 = pbVar27 + local_f8 + 4;
        *(uint *)pbVar1 = uVar17 ^ uVar57 + 0x3320646e;
        *(uint *)(pbVar1 + 4) = uVar18 ^ uVar49 + 0x79622d32;
        *(uint *)(pbVar1 + 8) = uVar19 ^ uVar40 + 0x6b206574;
        *(uint *)(pbVar1 + 0xc) = uVar20 ^ (uVar41 << 7 | uVar41 >> 0x19) + uVar2;
        pbVar1 = pbVar27 + local_f8 + 0x14;
        *(uint *)pbVar1 = (uVar36 << 7 | uVar36 >> 0x19) + local_48 ^ uVar21;
        *(uint *)(pbVar1 + 4) = (uVar33 << 7 | uVar33 >> 0x19) + iStack_44 ^ uVar22;
        *(uint *)(pbVar1 + 8) = (uVar29 << 7 | uVar29 >> 0x19) + iStack_40 ^ uVar23;
        *(uint *)(pbVar1 + 0xc) = uVar55 + iStack_3c ^ uVar24;
        pbVar1 = pbVar27 + local_f8 + 0x24;
        *(uint *)pbVar1 = local_68 + uVar38 ^ uVar13;
        *(uint *)(pbVar1 + 4) = iStack_64 + uVar28 ^ uVar14;
        *(uint *)(pbVar1 + 8) = iVar59 + uVar39 ^ uVar15;
        *(uint *)(pbVar1 + 0xc) = uVar6 + uVar58 ^ uVar16;
        *(uint *)(pbVar27 + local_f8 + 0x34) = uVar46 + uVar44 ^ uVar8;
        *(uint *)(pbVar27 + local_f8 + 0x38) = uVar48 + uVar5 ^ uVar9;
        *(uint *)(pbVar27 + local_f8 + 0x3c) = uVar50 + uVar30 ^ uVar10;
        if (local_f0 == 0) break;
        local_f8 = local_f8 + 0x40;
        uVar44 = uVar45;
        uVar6 = uVar43;
      }
      this->input[8] = uVar43;
      this->input[9] = uVar45;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar11) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("blocks * BLOCKLEN == out_bytes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                ,0xa7,"void ChaCha20Aligned::Crypt(Span<const std::byte>, Span<std::byte>)");
}

Assistant:

inline void ChaCha20Aligned::Crypt(Span<const std::byte> in_bytes, Span<std::byte> out_bytes) noexcept
{
    assert(in_bytes.size() == out_bytes.size());
    const unsigned char* m = UCharCast(in_bytes.data());
    unsigned char* c = UCharCast(out_bytes.data());
    size_t blocks = out_bytes.size() / BLOCKLEN;
    assert(blocks * BLOCKLEN == out_bytes.size());

    uint32_t x0, x1, x2, x3, x4, x5, x6, x7, x8, x9, x10, x11, x12, x13, x14, x15;
    uint32_t j4, j5, j6, j7, j8, j9, j10, j11, j12, j13, j14, j15;

    if (!blocks) return;

    j4 = input[0];
    j5 = input[1];
    j6 = input[2];
    j7 = input[3];
    j8 = input[4];
    j9 = input[5];
    j10 = input[6];
    j11 = input[7];
    j12 = input[8];
    j13 = input[9];
    j14 = input[10];
    j15 = input[11];

    for (;;) {
        x0 = 0x61707865;
        x1 = 0x3320646e;
        x2 = 0x79622d32;
        x3 = 0x6b206574;
        x4 = j4;
        x5 = j5;
        x6 = j6;
        x7 = j7;
        x8 = j8;
        x9 = j9;
        x10 = j10;
        x11 = j11;
        x12 = j12;
        x13 = j13;
        x14 = j14;
        x15 = j15;

        // The 20 inner ChaCha20 rounds are unrolled here for performance.
        REPEAT10(
            QUARTERROUND( x0, x4, x8,x12);
            QUARTERROUND( x1, x5, x9,x13);
            QUARTERROUND( x2, x6,x10,x14);
            QUARTERROUND( x3, x7,x11,x15);
            QUARTERROUND( x0, x5,x10,x15);
            QUARTERROUND( x1, x6,x11,x12);
            QUARTERROUND( x2, x7, x8,x13);
            QUARTERROUND( x3, x4, x9,x14);
        );

        x0 += 0x61707865;
        x1 += 0x3320646e;
        x2 += 0x79622d32;
        x3 += 0x6b206574;
        x4 += j4;
        x5 += j5;
        x6 += j6;
        x7 += j7;
        x8 += j8;
        x9 += j9;
        x10 += j10;
        x11 += j11;
        x12 += j12;
        x13 += j13;
        x14 += j14;
        x15 += j15;

        x0 ^= ReadLE32(m + 0);
        x1 ^= ReadLE32(m + 4);
        x2 ^= ReadLE32(m + 8);
        x3 ^= ReadLE32(m + 12);
        x4 ^= ReadLE32(m + 16);
        x5 ^= ReadLE32(m + 20);
        x6 ^= ReadLE32(m + 24);
        x7 ^= ReadLE32(m + 28);
        x8 ^= ReadLE32(m + 32);
        x9 ^= ReadLE32(m + 36);
        x10 ^= ReadLE32(m + 40);
        x11 ^= ReadLE32(m + 44);
        x12 ^= ReadLE32(m + 48);
        x13 ^= ReadLE32(m + 52);
        x14 ^= ReadLE32(m + 56);
        x15 ^= ReadLE32(m + 60);

        ++j12;
        if (!j12) ++j13;

        WriteLE32(c + 0, x0);
        WriteLE32(c + 4, x1);
        WriteLE32(c + 8, x2);
        WriteLE32(c + 12, x3);
        WriteLE32(c + 16, x4);
        WriteLE32(c + 20, x5);
        WriteLE32(c + 24, x6);
        WriteLE32(c + 28, x7);
        WriteLE32(c + 32, x8);
        WriteLE32(c + 36, x9);
        WriteLE32(c + 40, x10);
        WriteLE32(c + 44, x11);
        WriteLE32(c + 48, x12);
        WriteLE32(c + 52, x13);
        WriteLE32(c + 56, x14);
        WriteLE32(c + 60, x15);

        if (blocks == 1) {
            input[8] = j12;
            input[9] = j13;
            return;
        }
        blocks -= 1;
        c += BLOCKLEN;
        m += BLOCKLEN;
    }
}